

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

bool __thiscall
dgClusterList::IsClusterCoplanar(dgClusterList *this,dgBigPlane *plane,dgMeshEffect *mesh)

{
  dgBigVector *pdVar1;
  dgListNode *pdVar2;
  dgListNode **ppdVar3;
  dgEdge *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  
  pdVar1 = mesh->m_points;
  ppdVar3 = &(this->super_dgList<dgClusterFace>).m_first;
  while (pdVar2 = *ppdVar3, pdVar2 != (dgListNode *)0x0) {
    pdVar4 = (pdVar2->m_info).m_edge;
    do {
      auVar6._0_8_ = dgBigPlane::Evalue(plane,pdVar1 + pdVar4->m_incidentVertex);
      auVar6._8_56_ = extraout_var;
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar5 = vandpd_avx512vl(auVar6._0_16_,auVar5);
      if (9.999999747378752e-06 < auVar5._0_8_) goto LAB_00dae18a;
      pdVar4 = pdVar4->m_next;
    } while (pdVar4 != (pdVar2->m_info).m_edge);
    ppdVar3 = &pdVar2->m_next;
  }
LAB_00dae18a:
  return pdVar2 == (dgListNode *)0x0;
}

Assistant:

bool IsClusterCoplanar(const dgBigPlane& plane,
		  const dgMeshEffect& mesh) const
	  {
		  const dgBigVector* const points = (dgBigVector*) mesh.GetVertexPool();
		  for (dgListNode* node = GetFirst(); node; node = node->GetNext()) {
			  dgClusterFace& info = node->GetInfo();

			  dgEdge* ptr = info.m_edge;
			  do {
				  const dgBigVector& p = points[ptr->m_incidentVertex];
				  hacd::HaF64 dist = fabs(plane.Evalue(p));
				  if (dist > hacd::HaF64(1.0e-5f)) {
					  return false;
				  }
				  ptr = ptr->m_next;
			  } while (ptr != info.m_edge);
		  }

		  return true;
	  }